

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

ssize_t __thiscall Clasp::Cli::WriteCnf::write(WriteCnf *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  pointer pLVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar6;
  undefined4 in_register_00000034;
  long lVar7;
  
  (this->lits_).ebo_.size = 0;
  (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0xa0))
            ((long *)CONCAT44(in_register_00000034,__fd),&this->lits_);
  pLVar3 = (this->lits_).ebo_.buf;
  uVar1 = (this->lits_).ebo_.size;
  for (lVar7 = 0; (ulong)uVar1 << 2 != lVar7; lVar7 = lVar7 + 4) {
    uVar2 = *(uint *)((long)&pLVar3->rep_ + lVar7);
    uVar6 = uVar2 >> 2;
    uVar4 = -uVar6;
    if ((uVar2 & 2) == 0) {
      uVar4 = uVar6;
    }
    fprintf((FILE *)this->str_,"%d ",(ulong)uVar4);
  }
  iVar5 = fprintf((FILE *)this->str_,"%d\n",0);
  return CONCAT44(extraout_var,iVar5);
}

Assistant:

void WriteCnf::write(ClauseHead* h) {
	lits_.clear();
	h->toLits(lits_);
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end; ++it) {
		fprintf(str_, "%d ", toInt(*it));
	}
	fprintf(str_, "%d\n", 0);
}